

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  int64_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  sel_t sVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar14 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar14 = 0;
    lVar10 = 0;
    uVar7 = 0;
    uVar15 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar2[uVar7];
      }
      uVar12 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar12 = count;
      }
      uVar13 = uVar15;
      if (uVar8 == 0xffffffffffffffff) {
        if (uVar15 < uVar12) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->months;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar6 = &rdata[uVar15].micros;
          do {
            uVar8 = uVar15;
            if (psVar3 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar3[uVar15];
            }
            if (((iVar1 == ((interval_t *)(piVar6 + -1))->months) &&
                (ldata->days == *(int32_t *)((long)piVar6 + -4))) && (ldata->micros == *piVar6)) {
              bVar17 = false;
            }
            else {
              lVar16 = (long)ldata->days + ldata->micros / 86400000000;
              lVar9 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              bVar17 = true;
              if ((lVar16 / 0x1e + (long)iVar1 ==
                   (long)((interval_t *)(piVar6 + -1))->months + lVar9 / 0x1e) &&
                 (lVar16 % 0x1e == lVar9 % 0x1e)) {
                bVar17 = ldata->micros % 86400000000 != *piVar6 % 86400000000;
              }
            }
            psVar4[iVar14] = (sel_t)uVar8;
            iVar14 = iVar14 + bVar17;
            psVar5[lVar10] = (sel_t)uVar8;
            lVar10 = lVar10 + (ulong)(bVar17 ^ 1);
            uVar15 = uVar15 + 1;
            piVar6 = piVar6 + 2;
            uVar13 = uVar15;
          } while (uVar12 != uVar15);
        }
      }
      else if (uVar8 == 0) {
        uVar13 = uVar12;
        if (uVar15 < uVar12) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          do {
            sVar11 = (sel_t)uVar15;
            if (psVar3 != (sel_t *)0x0) {
              sVar11 = psVar3[uVar15];
            }
            psVar4[lVar10] = sVar11;
            lVar10 = lVar10 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
      }
      else if (uVar15 < uVar12) {
        psVar3 = sel->sel_vector;
        psVar4 = true_sel->sel_vector;
        psVar5 = false_sel->sel_vector;
        piVar6 = &rdata[uVar15].micros;
        uVar13 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            sVar11 = (int)uVar15 + (int)uVar13;
          }
          else {
            sVar11 = psVar3[uVar15 + uVar13];
          }
          if ((uVar8 >> (uVar13 & 0x3f) & 1) == 0) {
LAB_00f073f5:
            bVar17 = false;
          }
          else {
            if (((ldata->months == ((interval_t *)(piVar6 + -1))->months) &&
                (ldata->days == *(int32_t *)((long)piVar6 + -4))) && (ldata->micros == *piVar6))
            goto LAB_00f073f5;
            lVar16 = (long)ldata->days + ldata->micros / 86400000000;
            lVar9 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
            bVar17 = true;
            if (((long)ldata->months + lVar16 / 0x1e ==
                 (long)((interval_t *)(piVar6 + -1))->months + lVar9 / 0x1e) &&
               (lVar16 % 0x1e == lVar9 % 0x1e)) {
              bVar17 = ldata->micros % 86400000000 != *piVar6 % 86400000000;
            }
          }
          psVar4[iVar14] = sVar11;
          iVar14 = iVar14 + bVar17;
          psVar5[lVar10] = sVar11;
          lVar10 = (ulong)(bVar17 ^ 1) + lVar10;
          uVar13 = uVar13 + 1;
          piVar6 = piVar6 + 2;
        } while ((uVar15 - uVar12) + uVar13 != 0);
        uVar13 = uVar15 + uVar13;
      }
      uVar7 = uVar7 + 1;
      uVar15 = uVar13;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}